

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_0::readPixels(Functions *gl,Surface *screen)

{
  GLsizei GVar1;
  GLsizei GVar2;
  glReadPixelsFunc p_Var3;
  PixelBufferAccess local_48;
  
  p_Var3 = gl->readPixels;
  GVar1 = screen->m_width;
  GVar2 = screen->m_height;
  tcu::Surface::getAccess(&local_48,screen);
  (*p_Var3)(0,0,GVar1,GVar2,0x1908,0x1401,local_48.super_ConstPixelBufferAccess.m_data);
  return;
}

Assistant:

void readPixels (const glw::Functions& gl, tcu::Surface* screen)
{
	gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(),  GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());
}